

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::relocate
          (QArrayDataPointer<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
           *this,qsizetype offset,
          pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *in_RDI;
  pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> **unaff_retaddr;
  pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *res;
  pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *first;
  QArrayDataPointer<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::
  q_relocate_overlap_n<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>,long_long>
            (first,(longlong)in_RDI,
             (pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *)0x7dfd57);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>,std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x10 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }